

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_module *
lys_get_import_module(lys_module *module,char *prefix,int pref_len,char *name,int name_len)

{
  int iVar1;
  size_t sVar2;
  char *name_00;
  LY_ERR *pLVar3;
  int local_4c;
  int i;
  char *str;
  lys_module *main_module;
  int name_len_local;
  char *name_local;
  int pref_len_local;
  char *prefix_local;
  lys_module *module_local;
  
  if ((prefix != (char *)0x0) && (name != (char *)0x0)) {
    __assert_fail("!prefix || !name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x9e5,
                  "const struct lys_module *lys_get_import_module(const struct lys_module *, const char *, int, const char *, int)"
                 );
  }
  name_local._4_4_ = pref_len;
  if ((prefix != (char *)0x0) && (pref_len == 0)) {
    sVar2 = strlen(prefix);
    name_local._4_4_ = (int)sVar2;
  }
  main_module._4_4_ = name_len;
  if ((name != (char *)0x0) && (name_len == 0)) {
    sVar2 = strlen(name);
    main_module._4_4_ = (int)sVar2;
  }
  module_local = lys_main_module(module);
  if ((((prefix != (char *)0x0) &&
       ((((module->field_0x40 & 1) != 0 ||
         (iVar1 = strncmp(module_local->prefix,prefix,(long)name_local._4_4_), iVar1 != 0)) ||
        (module_local->prefix[name_local._4_4_] != '\0')))) &&
      ((((module->field_0x40 & 1) == 0 ||
        (iVar1 = strncmp(module->prefix,prefix,(long)name_local._4_4_), iVar1 != 0)) ||
       (module->prefix[name_local._4_4_] != '\0')))) ||
     ((name != (char *)0x0 &&
      ((iVar1 = strncmp(module_local->name,name,(long)main_module._4_4_), iVar1 != 0 ||
       (module_local->name[main_module._4_4_] != '\0')))))) {
    for (local_4c = 0; local_4c < (int)(uint)module->imp_size; local_4c = local_4c + 1) {
      if (((prefix == (char *)0x0) ||
          ((iVar1 = strncmp(module->imp[local_4c].prefix,prefix,(long)name_local._4_4_), iVar1 == 0
           && (module->imp[local_4c].prefix[name_local._4_4_] == '\0')))) &&
         ((name == (char *)0x0 ||
          ((iVar1 = strncmp((module->imp[local_4c].module)->name,name,(long)main_module._4_4_),
           iVar1 == 0 && ((module->imp[local_4c].module)->name[main_module._4_4_] == '\0')))))) {
        return module->imp[local_4c].module;
      }
    }
    if (name == (char *)0x0) {
      module_local = (lys_module *)0x0;
    }
    else {
      name_00 = strndup(name,(long)main_module._4_4_);
      if (name_00 == (char *)0x0) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_get_import_module");
        module_local = (lys_module *)0x0;
      }
      else {
        module_local = ly_ctx_get_module(module->ctx,name_00,(char *)0x0);
        free(name_00);
      }
    }
  }
  return module_local;
}

Assistant:

const struct lys_module *
lys_get_import_module(const struct lys_module *module, const char *prefix, int pref_len, const char *name, int name_len)
{
    const struct lys_module *main_module;
    char *str;
    int i;

    assert(!prefix || !name);

    if (prefix && !pref_len) {
        pref_len = strlen(prefix);
    }
    if (name && !name_len) {
        name_len = strlen(name);
    }

    main_module = lys_main_module(module);

    /* module own prefix, submodule own prefix, (sub)module own name */
    if ((!prefix || (!module->type && !strncmp(main_module->prefix, prefix, pref_len) && !main_module->prefix[pref_len])
                 || (module->type && !strncmp(module->prefix, prefix, pref_len) && !module->prefix[pref_len]))
            && (!name || (!strncmp(main_module->name, name, name_len) && !main_module->name[name_len]))) {
        return main_module;
    }

    /* standard import */
    for (i = 0; i < module->imp_size; ++i) {
        if ((!prefix || (!strncmp(module->imp[i].prefix, prefix, pref_len) && !module->imp[i].prefix[pref_len]))
                && (!name || (!strncmp(module->imp[i].module->name, name, name_len) && !module->imp[i].module->name[name_len]))) {
            return module->imp[i].module;
        }
    }

    /* module required by a foreign grouping, deviation, or submodule */
    if (name) {
        str = strndup(name, name_len);
        if (!str) {
            LOGMEM;
            return NULL;
        }
        main_module = ly_ctx_get_module(module->ctx, str, NULL);
        free(str);
        return main_module;
    }

    return NULL;
}